

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

RegDemoState * __thiscall
despot::MemoryPool<despot::RegDemoState>::Allocate(MemoryPool<despot::RegDemoState> *this)

{
  RegDemoState *pRVar1;
  pointer ppRVar2;
  
  ppRVar2 = (this->freelist_).
            super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->freelist_).
      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppRVar2) {
    NewChunk(this);
    ppRVar2 = (this->freelist_).
              super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  pRVar1 = ppRVar2[-1];
  (this->freelist_).
  super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppRVar2 + -1;
  if (pRVar1->field_0x8 != '\x01') {
    pRVar1->field_0x8 = 1;
    this->num_allocated_ = this->num_allocated_ + 1;
    return pRVar1;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,
                "T *despot::MemoryPool<despot::RegDemoState>::Allocate() [T = despot::RegDemoState]"
               );
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}